

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_csv.cpp
# Opt level: O0

void __thiscall
Csv_ContainerWithTwoMembersFourValues_Test::TestBody
          (Csv_ContainerWithTwoMembersFourValues_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *message;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  char (*in_R9) [2];
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  AssertHelper local_120;
  Message local_118;
  _List_node_base *local_110;
  _List_node_base *local_108;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_e8;
  char local_c8 [32];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  Csv_ContainerWithTwoMembersFourValues_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._2_1_ = 1;
  local_80 = &local_78;
  l.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"a,b",&local_81);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"c,d",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._2_1_ = 0;
  local_38 = &local_78;
  local_30 = 2;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_28,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                + 1));
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_150 = local_150 + -1;
    std::__cxx11::string::~string((string *)local_150);
  } while (local_150 != &local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  last._M_node = (_List_node_base *)0x1e9df6;
  testing::ElementsAre<char[2],char[2],char[2],char[2]>
            (&local_e8,(testing *)0x1e11a9,(char (*) [2])0x1e11b7,(char (*) [2])0x1e9df6,
             (char (*) [2])0x1e24a8,in_R9);
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_e8.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_e8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_e8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffe58._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher);
  local_108 = (_List_node_base *)
              std::
              begin<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_28);
  local_110 = (_List_node_base *)
              std::
              end<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_28);
  pstore::command_line::csv<std::_List_iterator<std::__cxx11::string>>
            (&local_100,(command_line *)local_108,
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_110,last);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_a8,local_c8,
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"csv (std::begin (l), std::end (l))");
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_csv.cpp"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_28);
  return;
}

Assistant:

TEST (Csv, ContainerWithTwoMembersFourValues) {
    std::list<std::string> l{{"a,b"}, {"c,d"}};
    EXPECT_THAT (csv (std::begin (l), std::end (l)), ElementsAre ("a", "b", "c", "d"));
}